

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_msl_add_shader_input(spvc_compiler compiler,spvc_msl_shader_interface_var *si)

{
  spvc_context_s *this;
  spvc_result sVar1;
  string sStack_48;
  MSLShaderInterfaceVariable local_28;
  
  if (compiler->backend == SPVC_BACKEND_MSL) {
    local_28.component = 0;
    local_28.rate = MSL_SHADER_VARIABLE_RATE_PER_VERTEX;
    local_28.location = si->location;
    local_28.format = si->format;
    local_28.builtin = si->builtin;
    local_28.vecsize = si->vecsize;
    spirv_cross::CompilerMSL::add_msl_shader_input
              ((CompilerMSL *)
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,&local_28);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::__cxx11::string::string
              ((string *)&sStack_48,"MSL function used on a non-MSL backend.",(allocator *)&local_28
              );
    spvc_context_s::report_error(this,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_msl_add_shader_input(spvc_compiler compiler, const spvc_msl_shader_interface_var *si)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLShaderInterfaceVariable input;
	input.location = si->location;
	input.format = static_cast<MSLShaderVariableFormat>(si->format);
	input.builtin = static_cast<spv::BuiltIn>(si->builtin);
	input.vecsize = si->vecsize;
	msl.add_msl_shader_input(input);
	return SPVC_SUCCESS;
#else
	(void)si;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}